

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io_tests.cpp
# Opt level: O3

void __thiscall key_io_tests::key_io_valid_parse::test_method(key_io_valid_parse *this)

{
  pointer pcVar1;
  size_type sVar2;
  undefined **ppuVar3;
  array<unsigned_char,_32UL> *paVar4;
  array<unsigned_char,_32UL> *paVar5;
  bool bVar6;
  bool bVar7;
  readonly_property65 rVar8;
  int iVar9;
  UniValue *pUVar10;
  UniValue *pUVar11;
  string *psVar12;
  optional<ChainType> oVar13;
  ulong uVar14;
  long lVar15;
  ulong index;
  byte bVar16;
  long lVar17;
  iterator in_R8;
  iterator pvVar18;
  iterator in_R9;
  iterator pvVar19;
  long in_FS_OFFSET;
  readonly_property<bool> rVar20;
  string_view jsondata;
  const_string file;
  string_view hex_str;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file_06;
  const_string file_07;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  string_view chain;
  vector<std::byte,_std::allocator<std::byte>_> exp_payload;
  string exp_base58string;
  string strTest;
  CTxDestination destination;
  UniValue tests;
  char *in_stack_fffffffffffffba0;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  assertion_result local_3b8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  vector<std::byte,_std::allocator<std::byte>_> local_288;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  byte local_240;
  array<unsigned_char,_32UL> *local_238;
  string *local_230;
  undefined1 local_228 [32];
  undefined8 local_208;
  shared_count sStack_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [24];
  undefined8 uStack_1a0;
  undefined1 local_198 [72];
  __index_type local_150;
  string local_148;
  undefined1 local_128 [32];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_108;
  undefined1 local_c0;
  UniValue local_b0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_key_io_valid_bytes;
  jsondata._M_len = 0x42b5;
  read_json(&local_b0,jsondata);
  local_240 = 0;
  local_238 = (array<unsigned_char,_32UL> *)0x0;
  local_108._16_8_ = (pointer)0x0;
  local_108._24_8_ = (pointer)0x0;
  local_108._0_8_ = 0;
  local_108._8_8_ = (pointer)0x0;
  local_c0 = 0;
  SelectParams(MAIN);
  if (local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pUVar10 = ::UniValue::operator[](&local_b0,index);
      ::UniValue::write_abi_cxx11_((UniValue *)local_128,(int)pUVar10,(void *)0x0,0);
      if ((ulong)(((long)(pUVar10->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pUVar10->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3) < 3) {
        local_250 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_248 = "";
        local_260 = &boost::unit_test::basic_cstring<char_const>::null;
        local_258 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0x23;
        file.m_begin = (iterator)&local_250;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_260,
                   msg);
        local_148._M_dataplus._M_p = local_148._M_dataplus._M_p & 0xffffffffffffff00;
        local_148._M_string_length = 0;
        local_148.field_2._M_allocated_capacity = 0;
        local_58[8] = 0;
        local_58._0_8_ = &PTR__lazy_ostream_01388a58;
        local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
        local_48._8_8_ = "Bad test: ";
        local_198._8_4_ = local_198._8_4_ & 0xffffff00;
        local_198._0_8_ = &PTR__lazy_ostream_01388a98;
        local_198._16_8_ = local_58;
        local_198._24_8_ = local_128;
        local_270 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
        ;
        local_268 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x1;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&local_148,(lazy_ostream *)local_198,1,1,WARN,
                   (check_type)in_stack_fffffffffffffba0,(size_t)&local_270,0x23);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&local_148.field_2._M_allocated_capacity);
      }
      else {
        pUVar11 = ::UniValue::operator[](pUVar10,0);
        psVar12 = ::UniValue::get_str_abi_cxx11_(pUVar11);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pcVar1 = (psVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar1,pcVar1 + psVar12->_M_string_length);
        pUVar11 = ::UniValue::operator[](pUVar10,1);
        psVar12 = ::UniValue::get_str_abi_cxx11_(pUVar11);
        hex_str._M_str = (psVar12->_M_dataplus)._M_p;
        hex_str._M_len = psVar12->_M_string_length;
        ParseHex<std::byte>(&local_288,hex_str);
        pUVar10 = ::UniValue::operator[](pUVar10,2);
        pUVar10 = ::UniValue::get_obj(pUVar10);
        key._M_str = "isPrivkey";
        key._M_len = 9;
        pUVar11 = ::UniValue::find_value(pUVar10,key);
        bVar6 = ::UniValue::get_bool(pUVar11);
        key_00._M_str = "chain";
        key_00._M_len = 5;
        pUVar11 = ::UniValue::find_value(pUVar10,key_00);
        psVar12 = ::UniValue::get_str_abi_cxx11_(pUVar11);
        chain._M_str = (psVar12->_M_dataplus)._M_p;
        chain._M_len = psVar12->_M_string_length;
        oVar13 = ChainTypeFromString(chain);
        if (((ulong)oVar13.super__Optional_base<ChainType,_true,_true>._M_payload.
                    super__Optional_payload_base<ChainType> >> 0x20 & 1) == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
          goto LAB_00408295;
        }
        SelectParams(oVar13.super__Optional_base<ChainType,_true,_true>._M_payload.
                     super__Optional_payload_base<ChainType>._M_payload);
        key_01._M_str = "tryCaseFlip";
        key_01._M_len = 0xb;
        pUVar11 = ::UniValue::find_value(pUVar10,key_01);
        if (pUVar11->typ == VNULL) {
          bVar7 = false;
        }
        else {
          key_02._M_str = "tryCaseFlip";
          key_02._M_len = 0xb;
          pUVar11 = ::UniValue::find_value(pUVar10,key_02);
          bVar7 = ::UniValue::get_bool(pUVar11);
        }
        if (bVar6) {
          key_03._M_str = "isCompressed";
          key_03._M_len = 0xc;
          pUVar10 = ::UniValue::find_value(pUVar10,key_03);
          bVar6 = ::UniValue::get_bool(pUVar10);
          DecodeSecret((string *)local_198);
          paVar5 = local_238;
          local_240 = local_198[0];
          paVar4 = (array<unsigned_char,_32UL> *)CONCAT44(local_198._12_4_,local_198._8_4_);
          local_198._8_4_ = 0;
          local_198._12_4_ = 0;
          bVar7 = local_238 != (array<unsigned_char,_32UL> *)0x0;
          local_238 = paVar4;
          if (bVar7) {
            SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                      ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_238,paVar5);
            if ((array<unsigned_char,_32UL> *)CONCAT44(local_198._12_4_,local_198._8_4_) !=
                (array<unsigned_char,_32UL> *)0x0) {
              SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                        ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_198 + 8),
                         (array<unsigned_char,_32UL> *)CONCAT44(local_198._12_4_,local_198._8_4_));
            }
          }
          local_298 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_290 = "";
          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0x30;
          file_00.m_begin = (iterator)&local_298;
          msg_00.m_end = in_R9;
          msg_00.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_2a8,msg_00);
          local_1b8[0] = local_238 != (array<unsigned_char,_32UL> *)0x0;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1b8._16_4_ = 0;
          local_1b8._20_4_ = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"!IsValid:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_2b8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_2b0 = "";
          pvVar18 = (iterator)0x1;
          pvVar19 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_1b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_2b8,0x30);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
          local_2c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_2c0 = "";
          local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_01.m_end = (iterator)0x31;
          file_01.m_begin = (iterator)&local_2c8;
          msg_01.m_end = pvVar19;
          msg_01.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_2d8,msg_01);
          local_1b8._0_8_ = CONCAT71(local_1b8._1_7_,bVar6 ^ local_240) ^ 1;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1b8._16_4_ = 0;
          local_1b8._20_4_ = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"compressed mismatch:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_2e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_2e0 = "";
          pvVar18 = (iterator)0x1;
          pvVar19 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_1b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_2e8,0x31);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
          local_2f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_2f0 = "";
          local_308 = &boost::unit_test::basic_cstring<char_const>::null;
          local_300 = &boost::unit_test::basic_cstring<char_const>::null;
          file_02.m_end = (iterator)0x32;
          file_02.m_begin = (iterator)&local_2f8;
          msg_02.m_end = pvVar19;
          msg_02.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_308,msg_02);
          lVar15 = (ulong)(local_238 != (array<unsigned_char,_32UL> *)0x0) * 0x20;
          rVar20.super_class_property<bool>.value =
               (class_property<bool>)
               (lVar15 ==
               (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start);
          if ((local_238 != (array<unsigned_char,_32UL> *)0x0) &&
             (lVar15 == (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
            lVar17 = 0;
            do {
              rVar20.super_class_property<bool>.value =
                   (class_property<bool>)
                   (local_238->_M_elems[lVar17] ==
                   local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17]);
              if (!(bool)rVar20.super_class_property<bool>.value) break;
              bVar6 = lVar15 + -1 != lVar17;
              lVar17 = lVar17 + 1;
            } while (bVar6);
          }
          local_1b8[0] = rVar20.super_class_property<bool>.value;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1b8._16_4_ = 0;
          local_1b8._20_4_ = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"key mismatch:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_318 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_310 = "";
          pvVar18 = (iterator)0x1;
          pvVar19 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_1b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_318,0x32);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
          DecodeDestination((CTxDestination *)local_198,&local_148);
          local_58._0_8_ = &local_108;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
            ::_S_vtable._M_arr[(long)(char)local_150 + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)local_58,
                     (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)local_198);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_198);
          local_328 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_320 = "";
          local_338 = &boost::unit_test::basic_cstring<char_const>::null;
          local_330 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x36;
          file_03.m_begin = (iterator)&local_328;
          msg_03.m_end = pvVar19;
          msg_03.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_338,msg_03);
          bVar6 = IsValidDestination((CTxDestination *)&local_108._M_first);
          local_1b8[0] = !bVar6;
          local_1b8._8_4_ = 0;
          local_1b8._12_4_ = 0;
          local_1b8._16_4_ = 0;
          local_1b8._20_4_ = 0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"IsValid privkey as pubkey:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_348 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_340 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_1b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_348,0x36);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
        }
        else {
          DecodeDestination((CTxDestination *)local_198,&local_148);
          local_58._0_8_ = &local_108;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
            ::_S_vtable._M_arr[(long)(char)local_150 + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)local_58,
                     (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)local_198);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_198);
          GetScriptForDestination((CScript *)local_1b8,(CTxDestination *)&local_108._M_first);
          local_358 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_350 = "";
          local_368 = &boost::unit_test::basic_cstring<char_const>::null;
          local_360 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0x3b;
          file_04.m_begin = (iterator)&local_358;
          msg_04.m_end = in_R9;
          msg_04.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_368,msg_04);
          rVar8.super_readonly_property<bool>.super_class_property<bool>.value =
               (readonly_property<bool>)IsValidDestination((CTxDestination *)&local_108._M_first);
          local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = rVar8.super_readonly_property<bool>.super_class_property<bool>.value;
          local_3b8.m_message.px = (element_type *)0x0;
          local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"!IsValid:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_378 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_370 = "";
          pvVar18 = (iterator)0x1;
          pvVar19 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    (&local_3b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_378,0x3b);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
          local_388 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_380 = "";
          local_398 = &boost::unit_test::basic_cstring<char_const>::null;
          local_390 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0x3c;
          file_05.m_begin = (iterator)&local_388;
          msg_05.m_end = pvVar19;
          msg_05.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_398,msg_05);
          local_3b8.m_message.px =
               (element_type *)((ulong)local_3b8.m_message.px & 0xffffffffffffff00);
          local_3b8._0_8_ = &PTR__lazy_ostream_01388f08;
          local_3b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_3a0 = "";
          sVar2 = uStack_1a0._4_4_ - 0x1d;
          ppuVar3 = (undefined **)local_1b8._0_8_;
          if (uStack_1a0 <
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d00000000) {
            sVar2 = uStack_1a0._4_4_;
            ppuVar3 = (undefined **)local_1b8;
          }
          s.m_size._0_4_ = sVar2;
          s.m_data = (uchar *)ppuVar3;
          s.m_size._4_4_ = 0;
          HexStr_abi_cxx11_(&local_1d8,s);
          s_00.m_size = (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          s_00.m_data = local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_1f8,s_00);
          if (local_1d8._M_string_length == local_1f8._M_string_length) {
            if (local_1d8._M_string_length == 0) {
              local_228[0x18] = true;
            }
            else {
              iVar9 = bcmp(local_1d8._M_dataplus._M_p,local_1f8._M_dataplus._M_p,
                           local_1d8._M_string_length);
              local_228[0x18] = iVar9 == 0;
            }
          }
          else {
            local_228[0x18] = false;
          }
          local_208 = 0;
          sStack_200.pi_ = (sp_counted_base *)0x0;
          local_228._8_8_ =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_228._16_8_ =
               (long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
               + 0x65;
          local_228._0_8_ = &local_1d8;
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388fc8;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_198._24_8_ = local_228;
          local_230 = &local_1f8;
          local_58[8] = 0;
          local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
          local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
          local_48._8_8_ = &local_230;
          in_stack_fffffffffffffba0 = "HexStr(script)";
          pvVar18 = (iterator)0x1;
          pvVar19 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)(local_228 + 0x18),(lazy_ostream *)&local_3b8,1,2,REQUIRE,
                     0xe76eb1,(size_t)(local_228 + 8),0x3c,
                     (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)local_198,"HexStr(exp_payload)",local_58);
          boost::detail::shared_count::~shared_count(&sStack_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if (local_148._M_string_length != 0) {
            lVar15 = 0;
            do {
              bVar16 = local_148._M_dataplus._M_p[lVar15];
              if ((byte)(bVar16 + 0x9f) < 0x1a) {
                bVar16 = bVar16 - 0x20;
LAB_00407818:
                local_148._M_dataplus._M_p[lVar15] = bVar16;
              }
              else if ((byte)(bVar16 + 0xbf) < 0x1a) {
                bVar16 = bVar16 | 0x20;
                goto LAB_00407818;
              }
              lVar15 = lVar15 + 1;
            } while (local_148._M_string_length != lVar15);
          }
          DecodeDestination((CTxDestination *)local_198,&local_148);
          local_58._0_8_ = &local_108;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
            ::_S_vtable._M_arr[(long)(char)local_150 + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)local_58,
                     (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)local_198);
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_198);
          local_3c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_3c0 = "";
          local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0x47;
          file_06.m_begin = (iterator)&local_3c8;
          msg_06.m_end = pvVar19;
          msg_06.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_3d8,msg_06);
          bVar6 = IsValidDestination((CTxDestination *)&local_108._M_first);
          local_3b8._0_8_ = CONCAT71(local_3b8._1_7_,bVar7 ^ bVar6) ^ 1;
          local_3b8.m_message.px = (element_type *)0x0;
          local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"!IsValid case flipped:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_3e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_3e0 = "";
          pvVar18 = (iterator)0x1;
          pvVar19 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    (&local_3b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_3e8,0x47);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
          bVar6 = IsValidDestination((CTxDestination *)&local_108._M_first);
          if (bVar6) {
            GetScriptForDestination((CScript *)local_198,(CTxDestination *)&local_108._M_first);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1cffffffff <
                uStack_1a0) {
              free((void *)local_1b8._0_8_);
            }
            local_1b8._16_4_ = local_198._16_4_;
            local_1b8._20_4_ = local_198._20_4_;
            local_1b8._0_8_ = local_198._0_8_;
            local_1b8._8_4_ = local_198._8_4_;
            local_1b8._12_4_ = local_198._12_4_;
            local_3f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
            ;
            local_3f0 = "";
            local_408 = &boost::unit_test::basic_cstring<char_const>::null;
            local_400 = &boost::unit_test::basic_cstring<char_const>::null;
            file_07.m_end = (iterator)0x4a;
            file_07.m_begin = (iterator)&local_3f8;
            msg_07.m_end = pvVar19;
            msg_07.m_begin = pvVar18;
            uStack_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198._24_8_;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                       (size_t)&local_408,msg_07);
            local_3b8.m_message.px =
                 (element_type *)((ulong)local_3b8.m_message.px & 0xffffffffffffff00);
            local_3b8._0_8_ = &PTR__lazy_ostream_01388f08;
            local_3b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_3a0 = "";
            sVar2 = uStack_1a0._4_4_ - 0x1d;
            ppuVar3 = (undefined **)local_1b8._0_8_;
            if (uStack_1a0 <
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d00000000) {
              sVar2 = uStack_1a0._4_4_;
              ppuVar3 = (undefined **)local_1b8;
            }
            s_01.m_size._0_4_ = sVar2;
            s_01.m_data = (uchar *)ppuVar3;
            s_01.m_size._4_4_ = 0;
            HexStr_abi_cxx11_(&local_1d8,s_01);
            s_02.m_size = (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            s_02.m_data = local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            HexStr_abi_cxx11_(&local_1f8,s_02);
            if (local_1d8._M_string_length == local_1f8._M_string_length) {
              if (local_1d8._M_string_length == 0) {
                local_228[0x18] = true;
              }
              else {
                iVar9 = bcmp(local_1d8._M_dataplus._M_p,local_1f8._M_dataplus._M_p,
                             local_1d8._M_string_length);
                local_228[0x18] = iVar9 == 0;
              }
            }
            else {
              local_228[0x18] = false;
            }
            local_208 = 0;
            sStack_200.pi_ = (sp_counted_base *)0x0;
            local_228._8_8_ =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
            ;
            local_228._16_8_ =
                 (long)
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
                 + 0x65;
            local_228._0_8_ = &local_1d8;
            local_198._8_4_ = local_198._8_4_ & 0xffffff00;
            local_198._0_8_ = &PTR__lazy_ostream_01388fc8;
            local_198._16_4_ = 0x139d138;
            local_198._20_4_ = 0;
            local_198._24_8_ = local_228;
            local_230 = &local_1f8;
            local_58[8] = 0;
            local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
            local_48._0_8_ = boost::unit_test::lazy_ostream::inst;
            local_48._8_8_ = &local_230;
            in_stack_fffffffffffffba0 = "HexStr(script)";
            pvVar18 = (iterator)0x1;
            pvVar19 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)(local_228 + 0x18),(lazy_ostream *)&local_3b8,1,2,REQUIRE
                       ,0xe76eb1,(size_t)(local_228 + 8),0x4a,
                       (_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)local_198,"HexStr(exp_payload)",local_58);
            boost::detail::shared_count::~shared_count(&sStack_200);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          DecodeSecret((string *)local_198);
          paVar5 = local_238;
          local_240 = local_198[0];
          paVar4 = (array<unsigned_char,_32UL> *)CONCAT44(local_198._12_4_,local_198._8_4_);
          local_198._8_4_ = 0;
          local_198._12_4_ = 0;
          bVar6 = local_238 != (array<unsigned_char,_32UL> *)0x0;
          local_238 = paVar4;
          if (bVar6) {
            SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                      ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_238,paVar5);
            if ((array<unsigned_char,_32UL> *)CONCAT44(local_198._12_4_,local_198._8_4_) !=
                (array<unsigned_char,_32UL> *)0x0) {
              SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                        ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_198 + 8),
                         (array<unsigned_char,_32UL> *)CONCAT44(local_198._12_4_,local_198._8_4_));
            }
          }
          local_418 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_410 = "";
          local_428 = &boost::unit_test::basic_cstring<char_const>::null;
          local_420 = &boost::unit_test::basic_cstring<char_const>::null;
          file_08.m_end = (iterator)0x4f;
          file_08.m_begin = (iterator)&local_418;
          msg_08.m_end = pvVar19;
          msg_08.m_begin = pvVar18;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                     (size_t)&local_428,msg_08);
          local_3b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)(local_238 == (array<unsigned_char,_32UL> *)0x0);
          local_3b8.m_message.px = (element_type *)0x0;
          local_3b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58,"IsValid pubkey as privkey:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_198._8_4_ = local_198._8_4_ & 0xffffff00;
          local_198._0_8_ = &PTR__lazy_ostream_01388e08;
          local_198._16_4_ = 0x139d138;
          local_198._20_4_ = 0;
          local_438 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/key_io_tests.cpp"
          ;
          local_430 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x1;
          local_198._24_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
          boost::test_tools::tt_detail::report_assertion
                    (&local_3b8,(lazy_ostream *)local_198,1,1,WARN,
                     (check_type)in_stack_fffffffffffffba0,(size_t)&local_438,0x4f);
          if ((_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)local_58._0_8_ !=
              (_Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
          boost::detail::shared_count::~shared_count(&local_3b8.m_message.pn);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1cffffffff <
              uStack_1a0) {
            free((void *)local_1b8._0_8_);
          }
        }
        if (local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      index = (ulong)((int)index + 1);
      uVar14 = ((long)local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (index <= uVar14 && uVar14 - index != 0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_108._M_first);
  if (local_238 != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_238,local_238);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
    operator_delete(local_b0.val._M_dataplus._M_p,local_b0.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00408295:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(key_io_valid_parse)
{
    UniValue tests = read_json(json_tests::key_io_valid);
    CKey privkey;
    CTxDestination destination;
    SelectParams(ChainType::MAIN);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 3) { // Allow for extra stuff (useful for comments)
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        std::string exp_base58string = test[0].get_str();
        const std::vector<std::byte> exp_payload{ParseHex<std::byte>(test[1].get_str())};
        const UniValue &metadata = test[2].get_obj();
        bool isPrivkey = metadata.find_value("isPrivkey").get_bool();
        SelectParams(ChainTypeFromString(metadata.find_value("chain").get_str()).value());
        bool try_case_flip = metadata.find_value("tryCaseFlip").isNull() ? false : metadata.find_value("tryCaseFlip").get_bool();
        if (isPrivkey) {
            bool isCompressed = metadata.find_value("isCompressed").get_bool();
            // Must be valid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(privkey.IsValid(), "!IsValid:" + strTest);
            BOOST_CHECK_MESSAGE(privkey.IsCompressed() == isCompressed, "compressed mismatch:" + strTest);
            BOOST_CHECK_MESSAGE(std::ranges::equal(privkey, exp_payload), "key mismatch:" + strTest);

            // Private key must be invalid public key
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(!IsValidDestination(destination), "IsValid privkey as pubkey:" + strTest);
        } else {
            // Must be valid public key
            destination = DecodeDestination(exp_base58string);
            CScript script = GetScriptForDestination(destination);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination), "!IsValid:" + strTest);
            BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));

            // Try flipped case version
            for (char& c : exp_base58string) {
                if (c >= 'a' && c <= 'z') {
                    c = (c - 'a') + 'A';
                } else if (c >= 'A' && c <= 'Z') {
                    c = (c - 'A') + 'a';
                }
            }
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination) == try_case_flip, "!IsValid case flipped:" + strTest);
            if (IsValidDestination(destination)) {
                script = GetScriptForDestination(destination);
                BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));
            }

            // Public key must be invalid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(!privkey.IsValid(), "IsValid pubkey as privkey:" + strTest);
        }
    }
}